

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O2

void __thiscall spv::Builder::createAndSetNoPredecessorBlock(Builder *this,char *param_1)

{
  Block *this_00;
  Id id;
  
  this_00 = (Block *)::operator_new(0x90);
  id = this->uniqueId + 1;
  this->uniqueId = id;
  Block::Block(this_00,id,this->buildPoint->parent);
  this_00->unreachable = true;
  spv::Function::addBlock(this->buildPoint->parent,this_00);
  this->buildPoint = this_00;
  this->dirtyLineTracker = true;
  this->dirtyScopeTracker = true;
  return;
}

Assistant:

void Builder::createAndSetNoPredecessorBlock(const char* /*name*/)
{
    Block* block = new Block(getUniqueId(), buildPoint->getParent());
    block->setUnreachable();
    buildPoint->getParent().addBlock(block);
    setBuildPoint(block);

    // if (name)
    //    addName(block->getId(), name);
}